

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool __thiscall ArgsManager::UseDefaultSection(ArgsManager *this,string *arg)

{
  long lVar1;
  __type_conflict1 _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_type sVar3;
  long in_RDI;
  long in_FS_OFFSET;
  byte bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  key_type *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ChainType in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x100);
  ChainTypeToString_abi_cxx11_(in_stack_ffffffffffffffdc);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),__rhs);
  bVar4 = true;
  if (!_Var2) {
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                    in_stack_ffffffffffffff90);
    bVar4 = sVar3 == 0;
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::UseDefaultSection(const std::string& arg) const
{
    return m_network == ChainTypeToString(ChainType::MAIN) || m_network_only_args.count(arg) == 0;
}